

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aws.c
# Opt level: O0

void nn_aws_handler(nn_fsm *self,int src,int type,void *srcptr)

{
  nn_usock *listener;
  uint in_EDX;
  uint in_ESI;
  nn_usock *in_RDI;
  uint8_t msg_type;
  size_t sz;
  int val;
  nn_aws *aws;
  nn_fsm_event *in_stack_ffffffffffffff88;
  undefined4 in_stack_ffffffffffffff90;
  undefined4 in_stack_ffffffffffffff94;
  undefined4 in_stack_ffffffffffffff98;
  undefined4 in_stack_ffffffffffffff9c;
  int in_stack_ffffffffffffffa0;
  int in_stack_ffffffffffffffa4;
  nn_usock *in_stack_ffffffffffffffa8;
  undefined4 in_stack_ffffffffffffffb0;
  
  if (in_RDI == (nn_usock *)0x0) {
    in_RDI = (nn_usock *)0x0;
  }
  listener = (nn_usock *)(ulong)(in_RDI->state - 1);
  switch(listener) {
  case (nn_usock *)0x0:
    if (in_ESI != 0xfffffffe) {
      nn_backtrace_print();
      fprintf(_stderr,"%s: state=%d source=%d action=%d (%s:%d)\n","Unexpected source",
              (ulong)(uint)in_RDI->state,(ulong)in_ESI,(ulong)in_EDX,
              "/workspace/llm4binary/github/license_all_cmakelists_25/nqbit[P]goestools/vendor/nanomsg/src/transports/ws/aws.c"
              ,0xac);
      fflush(_stderr);
      nn_err_abort();
    }
    if (in_EDX != 0xfffffffe) {
      nn_backtrace_print();
      fprintf(_stderr,"%s: state=%d source=%d action=%d (%s:%d)\n","Unexpected action",
              (ulong)(uint)in_RDI->state,0xfffffffe,(ulong)in_EDX,
              "/workspace/llm4binary/github/license_all_cmakelists_25/nqbit[P]goestools/vendor/nanomsg/src/transports/ws/aws.c"
              ,0xa8);
      fflush(_stderr);
      nn_err_abort();
    }
    nn_usock_accept(in_RDI,listener);
    in_RDI->state = 2;
    break;
  case (nn_usock *)0x1:
    if (in_ESI == 1) {
      if (in_EDX != 2) {
        nn_backtrace_print();
        fprintf(_stderr,"%s: state=%d source=%d action=%d (%s:%d)\n","Unexpected action",
                (ulong)(uint)in_RDI->state,1,(ulong)in_EDX,
                "/workspace/llm4binary/github/license_all_cmakelists_25/nqbit[P]goestools/vendor/nanomsg/src/transports/ws/aws.c"
                ,0xe4);
        fflush(_stderr);
        nn_err_abort();
      }
      nn_ep_clear_error((nn_ep *)0x201e0d);
      nn_ep_getopt((nn_ep *)CONCAT44(in_ESI,in_stack_ffffffffffffffb0),
                   (int)((ulong)in_stack_ffffffffffffffa8 >> 0x20),(int)in_stack_ffffffffffffffa8,
                   (void *)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0),
                   (size_t *)CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98));
      nn_usock_setsockopt(in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa4,
                          in_stack_ffffffffffffffa0,
                          (void *)CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98),
                          CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90));
      nn_ep_getopt((nn_ep *)CONCAT44(in_ESI,in_stack_ffffffffffffffb0),
                   (int)((ulong)in_stack_ffffffffffffffa8 >> 0x20),(int)in_stack_ffffffffffffffa8,
                   (void *)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0),
                   (size_t *)CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98));
      nn_usock_setsockopt(in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa4,
                          in_stack_ffffffffffffffa0,
                          (void *)CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98),
                          CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90));
      nn_ep_getopt((nn_ep *)CONCAT44(in_ESI,in_stack_ffffffffffffffb0),
                   (int)((ulong)in_stack_ffffffffffffffa8 >> 0x20),(int)in_stack_ffffffffffffffa8,
                   (void *)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0),
                   (size_t *)CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98));
      nn_usock_setsockopt(in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa4,
                          in_stack_ffffffffffffffa0,
                          (void *)CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98),
                          CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90));
      nn_usock_swap_owner((nn_usock *)CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90),
                          (nn_fsm_owner *)in_stack_ffffffffffffff88);
      *(undefined8 *)&in_RDI[1].s = 0;
      in_RDI[1].wfd.src = -1;
      in_RDI[1].wfd.owner = (nn_fsm *)0x0;
      nn_fsm_raise((nn_fsm *)CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90),
                   in_stack_ffffffffffffff88,0);
      nn_usock_activate((nn_usock *)0x20203d);
      nn_sws_start((nn_sws *)CONCAT44(in_ESI,in_stack_ffffffffffffffb0),in_stack_ffffffffffffffa8,
                   in_stack_ffffffffffffffa4,
                   (char *)CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98),
                   (char *)CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90),
                   (uint8_t)((ulong)in_stack_ffffffffffffff88 >> 0x38));
      in_RDI->state = 3;
      nn_ep_stat_increment
                ((nn_ep *)CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90),
                 (int)((ulong)in_stack_ffffffffffffff88 >> 0x20),(int)in_stack_ffffffffffffff88);
    }
    else {
      if (in_ESI != 3) {
        nn_backtrace_print();
        fprintf(_stderr,"%s: state=%d source=%d action=%d (%s:%d)\n","Unexpected source",
                (ulong)(uint)in_RDI->state,(ulong)in_ESI,(ulong)in_EDX,
                "/workspace/llm4binary/github/license_all_cmakelists_25/nqbit[P]goestools/vendor/nanomsg/src/transports/ws/aws.c"
                ,0xf5);
        fflush(_stderr);
        nn_err_abort();
      }
      if (in_EDX != 6) {
        nn_backtrace_print();
        fprintf(_stderr,"%s: state=%d source=%d action=%d (%s:%d)\n","Unexpected action",
                (ulong)(uint)in_RDI->state,3,(ulong)in_EDX,
                "/workspace/llm4binary/github/license_all_cmakelists_25/nqbit[P]goestools/vendor/nanomsg/src/transports/ws/aws.c"
                ,0xf1);
        fflush(_stderr);
        nn_err_abort();
      }
      nn_usock_geterrno(*(nn_usock **)&in_RDI[1].s);
      nn_ep_set_error((nn_ep *)CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90),
                      (int)((ulong)in_stack_ffffffffffffff88 >> 0x20));
      nn_ep_stat_increment
                ((nn_ep *)CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90),
                 (int)((ulong)in_stack_ffffffffffffff88 >> 0x20),(int)in_stack_ffffffffffffff88);
      nn_usock_accept(in_RDI,listener);
    }
    break;
  case (nn_usock *)0x2:
    if (in_ESI != 2) {
      nn_backtrace_print();
      fprintf(_stderr,"%s: state=%d source=%d action=%d (%s:%d)\n","Unexpected source",
              (ulong)(uint)in_RDI->state,(ulong)in_ESI,(ulong)in_EDX,
              "/workspace/llm4binary/github/license_all_cmakelists_25/nqbit[P]goestools/vendor/nanomsg/src/transports/ws/aws.c"
              ,0x110);
      fflush(_stderr);
      nn_err_abort();
    }
    if (in_EDX == 1) {
      nn_sws_stop((nn_sws *)0x202279);
      in_RDI->state = 4;
      nn_ep_stat_increment
                ((nn_ep *)CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90),
                 (int)((ulong)in_stack_ffffffffffffff88 >> 0x20),(int)in_stack_ffffffffffffff88);
    }
    else {
      if (in_EDX != 2) {
        nn_backtrace_print();
        fprintf(_stderr,"%s: state=%d source=%d action=%d (%s:%d)\n","Unexpected action",
                (ulong)(uint)in_RDI->state,2,(ulong)in_EDX,
                "/workspace/llm4binary/github/license_all_cmakelists_25/nqbit[P]goestools/vendor/nanomsg/src/transports/ws/aws.c"
                ,0x10c);
        fflush(_stderr);
        nn_err_abort();
      }
      nn_sws_stop((nn_sws *)0x202257);
      in_RDI->state = 4;
    }
    break;
  case (nn_usock *)0x3:
    if (in_ESI != 2) {
      nn_backtrace_print();
      fprintf(_stderr,"%s: state=%d source=%d action=%d (%s:%d)\n","Unexpected source",
              (ulong)(uint)in_RDI->state,(ulong)in_ESI,(ulong)in_EDX,
              "/workspace/llm4binary/github/license_all_cmakelists_25/nqbit[P]goestools/vendor/nanomsg/src/transports/ws/aws.c"
              ,0x126);
      fflush(_stderr);
      nn_err_abort();
    }
    if (in_EDX == 3) {
      nn_usock_stop((nn_usock *)0x20239c);
      in_RDI->state = 5;
    }
    else if (in_EDX != 8) {
      nn_backtrace_print();
      fprintf(_stderr,"%s: state=%d source=%d action=%d (%s:%d)\n","Unexpected action",
              (ulong)(uint)in_RDI->state,2,(ulong)in_EDX,
              "/workspace/llm4binary/github/license_all_cmakelists_25/nqbit[P]goestools/vendor/nanomsg/src/transports/ws/aws.c"
              ,0x122);
      fflush(_stderr);
      nn_err_abort();
    }
    break;
  case (nn_usock *)0x4:
    if (in_ESI != 1) {
      nn_backtrace_print();
      fprintf(_stderr,"%s: state=%d source=%d action=%d (%s:%d)\n","Unexpected source",
              (ulong)(uint)in_RDI->state,(ulong)in_ESI,(ulong)in_EDX,
              "/workspace/llm4binary/github/license_all_cmakelists_25/nqbit[P]goestools/vendor/nanomsg/src/transports/ws/aws.c"
              ,0x13c);
      fflush(_stderr);
      nn_err_abort();
    }
    if (in_EDX == 7) {
      nn_fsm_raise((nn_fsm *)CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90),
                   in_stack_ffffffffffffff88,0);
      in_RDI->state = 6;
    }
    else if (in_EDX != 8) {
      nn_backtrace_print();
      fprintf(_stderr,"%s: state=%d source=%d action=%d (%s:%d)\n","Unexpected action",
              (ulong)(uint)in_RDI->state,1,(ulong)in_EDX,
              "/workspace/llm4binary/github/license_all_cmakelists_25/nqbit[P]goestools/vendor/nanomsg/src/transports/ws/aws.c"
              ,0x138);
      fflush(_stderr);
      nn_err_abort();
    }
    break;
  default:
    nn_backtrace_print();
    fprintf(_stderr,"%s: state=%d source=%d action=%d (%s:%d)\n","Unexpected state",
            (ulong)(uint)in_RDI->state,(ulong)in_ESI,(ulong)in_EDX,
            "/workspace/llm4binary/github/license_all_cmakelists_25/nqbit[P]goestools/vendor/nanomsg/src/transports/ws/aws.c"
            ,0x143);
    fflush(_stderr);
    nn_err_abort();
  }
  return;
}

Assistant:

static void nn_aws_handler (struct nn_fsm *self, int src, int type,
    NN_UNUSED void *srcptr)
{
    struct nn_aws *aws;
    int val;
    size_t sz;
    uint8_t msg_type;

    aws = nn_cont (self, struct nn_aws, fsm);

    switch (aws->state) {

/******************************************************************************/
/*  IDLE state.                                                               */
/*  The state machine wasn't yet started.                                     */
/******************************************************************************/
    case NN_AWS_STATE_IDLE:
        switch (src) {

        case NN_FSM_ACTION:
            switch (type) {
            case NN_FSM_START:
                nn_usock_accept (&aws->usock, aws->listener);
                aws->state = NN_AWS_STATE_ACCEPTING;
                return;
            default:
                nn_fsm_bad_action (aws->state, src, type);
            }

        default:
            nn_fsm_bad_source (aws->state, src, type);
        }

/******************************************************************************/
/*  ACCEPTING state.                                                          */
/*  Waiting for incoming connection.                                          */
/******************************************************************************/
    case NN_AWS_STATE_ACCEPTING:
        switch (src) {

        case NN_AWS_SRC_USOCK:
            switch (type) {
            case NN_USOCK_ACCEPTED:
                nn_ep_clear_error (aws->ep);

                /*  Set the relevant socket options. */
                sz = sizeof (val);
                nn_ep_getopt (aws->ep, NN_SOL_SOCKET, NN_SNDBUF, &val, &sz);
                nn_assert (sz == sizeof (val));
                nn_usock_setsockopt (&aws->usock, SOL_SOCKET, SO_SNDBUF,
                    &val, sizeof (val));
                sz = sizeof (val);
                nn_ep_getopt (aws->ep, NN_SOL_SOCKET, NN_RCVBUF, &val, &sz);
                nn_assert (sz == sizeof (val));
                nn_usock_setsockopt (&aws->usock, SOL_SOCKET, SO_RCVBUF,
                    &val, sizeof (val));
                sz = sizeof (val);
                nn_ep_getopt (aws->ep, NN_WS, NN_WS_MSG_TYPE, &val, &sz);
                msg_type = (uint8_t)val;

                /*   Since the WebSocket handshake must poll, the receive
                     timeout is set to zero. Later, it will be set again
                     to the value specified by the socket option. */
                val = 0;
                sz = sizeof (val);
                nn_usock_setsockopt (&aws->usock, SOL_SOCKET, SO_RCVTIMEO,
                    &val, sizeof (val));

                /*  Return ownership of the listening socket to the parent. */
                nn_usock_swap_owner (aws->listener, &aws->listener_owner);
                aws->listener = NULL;
                aws->listener_owner.src = -1;
                aws->listener_owner.fsm = NULL;
                nn_fsm_raise (&aws->fsm, &aws->accepted, NN_AWS_ACCEPTED);

                /*  Start the sws state machine. */
                nn_usock_activate (&aws->usock);
                nn_sws_start (&aws->sws, &aws->usock, NN_WS_SERVER,
                    NULL, NULL, msg_type);
                aws->state = NN_AWS_STATE_ACTIVE;

                nn_ep_stat_increment (aws->ep, NN_STAT_ACCEPTED_CONNECTIONS, 1);

                return;

            default:
                nn_fsm_bad_action (aws->state, src, type);
            }

        case NN_AWS_SRC_LISTENER:
            switch (type) {

            case NN_USOCK_ACCEPT_ERROR:
                nn_ep_set_error (aws->ep, nn_usock_geterrno (aws->listener));
                nn_ep_stat_increment (aws->ep, NN_STAT_ACCEPT_ERRORS, 1);
                nn_usock_accept (&aws->usock, aws->listener);
                return;

            default:
                nn_fsm_bad_action (aws->state, src, type);
            }

        default:
            nn_fsm_bad_source (aws->state, src, type);
        }

/******************************************************************************/
/*  ACTIVE state.                                                             */
/******************************************************************************/
    case NN_AWS_STATE_ACTIVE:
        switch (src) {

        case NN_AWS_SRC_SWS:
            switch (type) {
            case NN_SWS_RETURN_CLOSE_HANDSHAKE:
                /*  Peer closed connection without intention to reconnect, or
                    local endpoint failed remote because of invalid data. */
                nn_sws_stop (&aws->sws);
                aws->state = NN_AWS_STATE_STOPPING_SWS;
                return;
            case NN_SWS_RETURN_ERROR:
                nn_sws_stop (&aws->sws);
                aws->state = NN_AWS_STATE_STOPPING_SWS;
                nn_ep_stat_increment (aws->ep, NN_STAT_BROKEN_CONNECTIONS, 1);
                return;
            default:
                nn_fsm_bad_action (aws->state, src, type);
            }

        default:
            nn_fsm_bad_source (aws->state, src, type);
        }

/******************************************************************************/
/*  STOPPING_SWS state.                                                       */
/******************************************************************************/
    case NN_AWS_STATE_STOPPING_SWS:
        switch (src) {

        case NN_AWS_SRC_SWS:
            switch (type) {
            case NN_USOCK_SHUTDOWN:
                return;
            case NN_SWS_RETURN_STOPPED:
                nn_usock_stop (&aws->usock);
                aws->state = NN_AWS_STATE_STOPPING_USOCK;
                return;
            default:
                nn_fsm_bad_action (aws->state, src, type);
            }

        default:
            nn_fsm_bad_source (aws->state, src, type);
        }

/******************************************************************************/
/*  STOPPING_USOCK state.                                                     */
/******************************************************************************/
    case NN_AWS_STATE_STOPPING_USOCK:
        switch (src) {

        case NN_AWS_SRC_USOCK:
            switch (type) {
            case NN_USOCK_SHUTDOWN:
                return;
            case NN_USOCK_STOPPED:
                nn_fsm_raise (&aws->fsm, &aws->done, NN_AWS_ERROR);
                aws->state = NN_AWS_STATE_DONE;
                return;
            default:
                nn_fsm_bad_action (aws->state, src, type);
            }

        default:
            nn_fsm_bad_source (aws->state, src, type);
        }

/******************************************************************************/
/*  Invalid state.                                                            */
/******************************************************************************/
    default:
        nn_fsm_bad_state (aws->state, src, type);
    }
}